

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O0

bool __thiscall irr::core::CMatrix4<float>::getInverse(CMatrix4<float> *this,CMatrix4<float> *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float *pfVar47;
  CMatrix4<float> *in_RSI;
  CMatrix4<float> *in_RDI;
  float fVar48;
  f32 fVar49;
  f32 d;
  CMatrix4<float> *m;
  bool local_1;
  
  pfVar47 = operator[](in_RDI,0);
  fVar48 = *pfVar47;
  pfVar47 = operator[](in_RDI,5);
  fVar1 = *pfVar47;
  pfVar47 = operator[](in_RDI,1);
  fVar2 = *pfVar47;
  pfVar47 = operator[](in_RDI,4);
  fVar3 = *pfVar47;
  pfVar47 = operator[](in_RDI,10);
  fVar4 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xf);
  fVar5 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xb);
  fVar6 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xe);
  fVar7 = *pfVar47;
  pfVar47 = operator[](in_RDI,0);
  fVar8 = *pfVar47;
  pfVar47 = operator[](in_RDI,6);
  fVar9 = *pfVar47;
  pfVar47 = operator[](in_RDI,2);
  fVar10 = *pfVar47;
  pfVar47 = operator[](in_RDI,4);
  fVar11 = *pfVar47;
  pfVar47 = operator[](in_RDI,9);
  fVar12 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xf);
  fVar13 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xb);
  fVar14 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xd);
  fVar15 = *pfVar47;
  pfVar47 = operator[](in_RDI,0);
  fVar16 = *pfVar47;
  pfVar47 = operator[](in_RDI,7);
  fVar17 = *pfVar47;
  pfVar47 = operator[](in_RDI,3);
  fVar18 = *pfVar47;
  pfVar47 = operator[](in_RDI,4);
  fVar19 = *pfVar47;
  pfVar47 = operator[](in_RDI,9);
  fVar20 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xe);
  fVar21 = *pfVar47;
  pfVar47 = operator[](in_RDI,10);
  fVar22 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xd);
  fVar23 = *pfVar47;
  pfVar47 = operator[](in_RDI,1);
  fVar24 = *pfVar47;
  pfVar47 = operator[](in_RDI,6);
  fVar25 = *pfVar47;
  pfVar47 = operator[](in_RDI,2);
  fVar26 = *pfVar47;
  pfVar47 = operator[](in_RDI,5);
  fVar27 = *pfVar47;
  pfVar47 = operator[](in_RDI,8);
  fVar28 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xf);
  fVar29 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xb);
  fVar30 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xc);
  fVar31 = *pfVar47;
  pfVar47 = operator[](in_RDI,1);
  fVar32 = *pfVar47;
  pfVar47 = operator[](in_RDI,7);
  fVar33 = *pfVar47;
  pfVar47 = operator[](in_RDI,3);
  fVar34 = *pfVar47;
  pfVar47 = operator[](in_RDI,5);
  fVar35 = *pfVar47;
  pfVar47 = operator[](in_RDI,8);
  fVar36 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xe);
  fVar37 = *pfVar47;
  pfVar47 = operator[](in_RDI,10);
  fVar38 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xc);
  fVar39 = *pfVar47;
  pfVar47 = operator[](in_RDI,2);
  fVar40 = *pfVar47;
  pfVar47 = operator[](in_RDI,7);
  fVar41 = *pfVar47;
  pfVar47 = operator[](in_RDI,3);
  fVar42 = *pfVar47;
  pfVar47 = operator[](in_RDI,6);
  fVar43 = *pfVar47;
  pfVar47 = operator[](in_RDI,8);
  fVar44 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xd);
  fVar45 = *pfVar47;
  pfVar47 = operator[](in_RDI,9);
  fVar46 = *pfVar47;
  pfVar47 = operator[](in_RDI,0xc);
  fVar48 = (fVar40 * fVar41 + -(fVar42 * fVar43)) * (fVar44 * fVar45 + -(fVar46 * *pfVar47)) +
           -(fVar32 * fVar33 + -(fVar34 * fVar35)) * (fVar36 * fVar37 + -(fVar38 * fVar39)) +
           (fVar24 * fVar25 + -(fVar26 * fVar27)) * (fVar28 * fVar29 + -(fVar30 * fVar31)) +
           (fVar16 * fVar17 + -(fVar18 * fVar19)) * (fVar20 * fVar21 + -(fVar22 * fVar23)) +
           (fVar48 * fVar1 + -(fVar2 * fVar3)) * (fVar4 * fVar5 + -(fVar6 * fVar7)) +
           -((fVar8 * fVar9 + -(fVar10 * fVar11)) * (fVar12 * fVar13 + -(fVar14 * fVar15)));
  local_1 = iszero((f32)fVar48,1.1754944e-38);
  if (!local_1) {
    fVar49 = reciprocal((f32)fVar48);
    pfVar47 = operator[](in_RDI,5);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,9);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,1);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0xd);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,2);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,1);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,3);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,6);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,4);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,10);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,5);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0xe);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,6);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,2);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,7);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,7);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,8);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0xb);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xf);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,9);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0xf);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,3);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,10);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,3);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xb);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,7);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0xb);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,4);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0xc);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,8);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xc);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0xd);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0xc);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xd);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,0xe);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,0);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0xe);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
    pfVar47 = operator[](in_RDI,0);
    fVar48 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar1 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar2 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar3 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar4 = *pfVar47;
    pfVar47 = operator[](in_RDI,1);
    fVar5 = *pfVar47;
    pfVar47 = operator[](in_RDI,6);
    fVar6 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar7 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar8 = *pfVar47;
    pfVar47 = operator[](in_RDI,10);
    fVar9 = *pfVar47;
    pfVar47 = operator[](in_RDI,2);
    fVar10 = *pfVar47;
    pfVar47 = operator[](in_RDI,4);
    fVar11 = *pfVar47;
    pfVar47 = operator[](in_RDI,9);
    fVar12 = *pfVar47;
    pfVar47 = operator[](in_RDI,5);
    fVar13 = *pfVar47;
    pfVar47 = operator[](in_RDI,8);
    fVar14 = *pfVar47;
    pfVar47 = operator[](in_RSI,0xf);
    *pfVar47 = (float)fVar49 *
               (fVar10 * (fVar11 * fVar12 + -(fVar13 * fVar14)) +
               fVar48 * (fVar1 * fVar2 + -(fVar3 * fVar4)) +
               fVar5 * (fVar6 * fVar7 + -(fVar8 * fVar9)));
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

inline bool CMatrix4<T>::getInverse(CMatrix4<T> &out) const
{
	/// Calculates the inverse of this Matrix
	/// The inverse is calculated using Cramers rule.
	/// If no inverse exists then 'false' is returned.

#if defined(USE_MATRIX_TEST)
	if (this->isIdentity()) {
		out = *this;
		return true;
	}
#endif
	const CMatrix4<T> &m = *this;

	f32 d = (m[0] * m[5] - m[1] * m[4]) * (m[10] * m[15] - m[11] * m[14]) -
			(m[0] * m[6] - m[2] * m[4]) * (m[9] * m[15] - m[11] * m[13]) +
			(m[0] * m[7] - m[3] * m[4]) * (m[9] * m[14] - m[10] * m[13]) +
			(m[1] * m[6] - m[2] * m[5]) * (m[8] * m[15] - m[11] * m[12]) -
			(m[1] * m[7] - m[3] * m[5]) * (m[8] * m[14] - m[10] * m[12]) +
			(m[2] * m[7] - m[3] * m[6]) * (m[8] * m[13] - m[9] * m[12]);

	if (core::iszero(d, FLT_MIN))
		return false;

	d = core::reciprocal(d);

	out[0] = d * (m[5] * (m[10] * m[15] - m[11] * m[14]) +
						 m[6] * (m[11] * m[13] - m[9] * m[15]) +
						 m[7] * (m[9] * m[14] - m[10] * m[13]));
	out[1] = d * (m[9] * (m[2] * m[15] - m[3] * m[14]) +
						 m[10] * (m[3] * m[13] - m[1] * m[15]) +
						 m[11] * (m[1] * m[14] - m[2] * m[13]));
	out[2] = d * (m[13] * (m[2] * m[7] - m[3] * m[6]) +
						 m[14] * (m[3] * m[5] - m[1] * m[7]) +
						 m[15] * (m[1] * m[6] - m[2] * m[5]));
	out[3] = d * (m[1] * (m[7] * m[10] - m[6] * m[11]) +
						 m[2] * (m[5] * m[11] - m[7] * m[9]) +
						 m[3] * (m[6] * m[9] - m[5] * m[10]));
	out[4] = d * (m[6] * (m[8] * m[15] - m[11] * m[12]) +
						 m[7] * (m[10] * m[12] - m[8] * m[14]) +
						 m[4] * (m[11] * m[14] - m[10] * m[15]));
	out[5] = d * (m[10] * (m[0] * m[15] - m[3] * m[12]) +
						 m[11] * (m[2] * m[12] - m[0] * m[14]) +
						 m[8] * (m[3] * m[14] - m[2] * m[15]));
	out[6] = d * (m[14] * (m[0] * m[7] - m[3] * m[4]) +
						 m[15] * (m[2] * m[4] - m[0] * m[6]) +
						 m[12] * (m[3] * m[6] - m[2] * m[7]));
	out[7] = d * (m[2] * (m[7] * m[8] - m[4] * m[11]) +
						 m[3] * (m[4] * m[10] - m[6] * m[8]) +
						 m[0] * (m[6] * m[11] - m[7] * m[10]));
	out[8] = d * (m[7] * (m[8] * m[13] - m[9] * m[12]) +
						 m[4] * (m[9] * m[15] - m[11] * m[13]) +
						 m[5] * (m[11] * m[12] - m[8] * m[15]));
	out[9] = d * (m[11] * (m[0] * m[13] - m[1] * m[12]) +
						 m[8] * (m[1] * m[15] - m[3] * m[13]) +
						 m[9] * (m[3] * m[12] - m[0] * m[15]));
	out[10] = d * (m[15] * (m[0] * m[5] - m[1] * m[4]) +
						  m[12] * (m[1] * m[7] - m[3] * m[5]) +
						  m[13] * (m[3] * m[4] - m[0] * m[7]));
	out[11] = d * (m[3] * (m[5] * m[8] - m[4] * m[9]) +
						  m[0] * (m[7] * m[9] - m[5] * m[11]) +
						  m[1] * (m[4] * m[11] - m[7] * m[8]));
	out[12] = d * (m[4] * (m[10] * m[13] - m[9] * m[14]) +
						  m[5] * (m[8] * m[14] - m[10] * m[12]) +
						  m[6] * (m[9] * m[12] - m[8] * m[13]));
	out[13] = d * (m[8] * (m[2] * m[13] - m[1] * m[14]) +
						  m[9] * (m[0] * m[14] - m[2] * m[12]) +
						  m[10] * (m[1] * m[12] - m[0] * m[13]));
	out[14] = d * (m[12] * (m[2] * m[5] - m[1] * m[6]) +
						  m[13] * (m[0] * m[6] - m[2] * m[4]) +
						  m[14] * (m[1] * m[4] - m[0] * m[5]));
	out[15] = d * (m[0] * (m[5] * m[10] - m[6] * m[9]) +
						  m[1] * (m[6] * m[8] - m[4] * m[10]) +
						  m[2] * (m[4] * m[9] - m[5] * m[8]));

#if defined(USE_MATRIX_TEST)
	out.definitelyIdentityMatrix = definitelyIdentityMatrix;
#endif
	return true;
}